

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  Object *pOVar1;
  allocator local_39;
  string local_38 [32];
  Object *local_18;
  Object *obj;
  
  obj._4_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"C",&local_39);
  pOVar1 = Object::CreateObject((string *)local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (pOVar1 != (Object *)0x0) {
    local_18 = pOVar1;
    (*pOVar1->_vptr_Object[1])();
  }
  return 0;
}

Assistant:

int main()
{
    Object* obj = Object::CreateObject("C");
    delete obj;
    return 0;
}